

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::StyledStreamWriter::isMultineArray(StyledStreamWriter *this,Value *value)

{
  bool bVar1;
  ArrayIndex AVar2;
  ArrayIndex AVar3;
  Value *pVVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  
  AVar2 = Value::size(value);
  bVar8 = this->rightMargin_ <= (int)(AVar2 * 3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->childValues_);
  if (0 < (int)AVar2 && !bVar8) {
    iVar5 = 1;
    do {
      pVVar4 = Value::operator[](value,iVar5 + -1);
      if ((*(ushort *)&pVVar4->field_0x8 & 0xfe) == 6) {
        AVar3 = Value::size(pVVar4);
        bVar8 = AVar3 != 0;
      }
      else {
        bVar8 = false;
      }
    } while ((iVar5 < (int)AVar2) && (iVar5 = iVar5 + 1, !bVar8));
  }
  bVar1 = true;
  if (!bVar8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&this->childValues_,(long)(int)AVar2);
    this->addChildValues_ = true;
    iVar5 = AVar2 * 2 + 2;
    if (0 < (int)AVar2) {
      lVar6 = 8;
      uVar7 = 0;
      do {
        pVVar4 = Value::operator[](value,(int)uVar7);
        writeValue(this,pVVar4);
        iVar5 = iVar5 + *(int *)((long)&(((this->childValues_).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar6);
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 0x20;
      } while (AVar2 != uVar7);
    }
    this->addChildValues_ = false;
    bVar1 = this->rightMargin_ <= iVar5;
  }
  return bVar1;
}

Assistant:

bool StyledStreamWriter::isMultineArray(const Value& value) {
  int size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (int index = 0; index < size && !isMultiLine; ++index) {
    const Value& childValue = value[index];
    isMultiLine =
        isMultiLine || ((childValue.isArray() || childValue.isObject()) &&
                        childValue.size() > 0);
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    int lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (int index = 0; index < size; ++index) {
      writeValue(value[index]);
      lineLength += int(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}